

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::pop_context(match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,regex_impl *impl,bool success)

{
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *what_00;
  byte bVar2;
  sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *subs;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  size_type sVar4;
  byte in_DL;
  results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  match_results *results;
  nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nested;
  match_results *what;
  match_context *context;
  regex_impl *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar2 = in_DL & 1;
  pmVar1 = (in_RDI->context_).prev_context_;
  if (bVar2 == 0) {
    what_00 = pmVar1->results_ptr_;
    uninit_(in_RDI,in_stack_ffffffffffffffb8,(match_results *)0x168a81);
    core_access<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::get_nested_results(what_00);
    results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reclaim_last(in_RSI,(nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(bVar2,in_stack_ffffffffffffffe8));
  }
  (in_RDI->context_).results_ptr_ = pmVar1->results_ptr_;
  (in_RDI->context_).prev_context_ = pmVar1->prev_context_;
  (in_RDI->context_).next_ptr_ = pmVar1->next_ptr_;
  (in_RDI->context_).traits_ = pmVar1->traits_;
  subs = core_access<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::get_sub_match_vector((in_RDI->context_).results_ptr_);
  psVar3 = core_access<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_sub_matches(subs);
  in_RDI->sub_matches_ = psVar3;
  sVar4 = match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x168b04);
  in_RDI->mark_count_ = sVar4;
  return (bool)(bVar2 & 1);
}

Assistant:

bool pop_context(regex_impl const &impl, bool success)
    {
        match_context &context = *this->context_.prev_context_;
        if(!success)
        {
            match_results &what = *context.results_ptr_;
            this->uninit_(impl, what);

            // send the match_results struct back to the cache
            nested_results<BidiIter> &nested = access::get_nested_results(what);
            this->extras_->results_cache_.reclaim_last(nested);
        }

        // restore the state
        this->context_ = context;
        match_results &results = *this->context_.results_ptr_;
        this->sub_matches_ = access::get_sub_matches(access::get_sub_match_vector(results));
        this->mark_count_ = results.size();
        return success;
    }